

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

const_buffers_1
asio::buffer<char,std::char_traits<char>>(basic_string_view<char,_std::char_traits<char>_> data)

{
  size_type sVar1;
  void *in_stack_ffffffffffffffc8;
  const_buffers_1 *local_28;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  const_buffer local_10;
  
  sVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20);
  if (sVar1 == 0) {
    local_28 = (const_buffers_1 *)0x0;
  }
  else {
    local_28 = (const_buffers_1 *)
               CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[](&local_20,0);
  }
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20);
  const_buffers_1::const_buffers_1(local_28,in_stack_ffffffffffffffc8,0x204582);
  return (const_buffers_1)local_10;
}

Assistant:

ASIO_NODISCARD inline ASIO_CONST_BUFFER buffer(
    basic_string_view<Elem, Traits> data) noexcept
{
  return ASIO_CONST_BUFFER(data.size() ? &data[0] : 0,
      data.size() * sizeof(Elem)
#if defined(ASIO_ENABLE_BUFFER_DEBUGGING)
      , detail::buffer_debug_check<
          typename basic_string_view<Elem, Traits>::iterator
        >(data.begin())
#endif // ASIO_ENABLE_BUFFER_DEBUGGING
      );
}